

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.cpp
# Opt level: O2

int Signal::downsample(double *in,int inLength,double **out,int *outLength,int factor)

{
  double *pdVar1;
  int iVar2;
  ulong uVar3;
  
  if (in == (double *)0x0) {
    printf("Input buffer is NULL! Aborting downsampling");
    iVar2 = -1;
  }
  else {
    *outLength = inLength / factor;
    pdVar1 = *out;
    if (pdVar1 == (double *)0x0) {
      pdVar1 = (double *)malloc((long)(inLength / factor) << 3);
      *out = pdVar1;
    }
    iVar2 = 0;
    for (uVar3 = 0; (long)uVar3 < (long)inLength; uVar3 = uVar3 + (long)factor) {
      pdVar1[(int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                  (long)factor)] = in[uVar3];
    }
  }
  return iVar2;
}

Assistant:

int Signal::downsample(double * in, int inLength, double ** out, int * outLength, int factor)
{
	int i;

	// Return error if the input signal is empty
	if (in == NULL)
	{
		printf("Input buffer is NULL! Aborting downsampling");
		return -1;
	}

	// Compute the output signal length
	*outLength = inLength / factor;

	// If the output signal is not allocated, allocate it
	if (*out == NULL)
	{
		*out = (double *)malloc(*outLength * sizeof(double));
	}

	// Perform the downsampling
	for (i = 0; i < inLength; i += factor)
	{
		(*out)[i / factor] = in[i];
	}

	return 0;
}